

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

bool Diligent::LinuxFileSystem::DeleteDirectory(Char *strPath)

{
  int iVar1;
  allocator local_29;
  string path;
  
  std::__cxx11::string::string((string *)&path,strPath,&local_29);
  BasicFileSystem::CorrectSlashes(&path,'\0');
  iVar1 = nftw(path._M_dataplus._M_p,DeleteDirectory::anon_class_1_0_00000001::__invoke,0x20,0xb);
  std::__cxx11::string::~string((string *)&path);
  return iVar1 == 0;
}

Assistant:

bool LinuxFileSystem::DeleteDirectory(const Char* strPath)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback =
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            return remove(Path);
        };

    const auto res = nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
    return res == 0;
}